

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder
          (LLVMPointerGraphBuilder *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  long in_RDX;
  size_t in_RSI;
  LLVMPointerAnalysisOptions *in_RDI;
  PointerGraph *unaff_retaddr;
  LLVMPointerAnalysisOptions *in_stack_ffffffffffffffd8;
  
  PointerGraph::PointerGraph(unaff_retaddr);
  PointsToMapping<const_llvm::Value_*>::PointsToMapping
            ((PointsToMapping<const_llvm::Value_*> *)0x150003);
  in_RDI[1].super_PointerAnalysisOptions.maxIterations = in_RSI;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(in_RDI,in_stack_ffffffffffffffd8);
  *(undefined1 *)&in_RDI[2].analysisType = fi;
  *(byte *)((long)&in_RDI[2].analysisType + 1) = 0;
  *(byte *)((long)&in_RDI[2].analysisType + 2) = *(byte *)(in_RDX + 0x6c) & 1;
  std::
  unordered_map<const_llvm::Function_*,_dg::pta::LLVMPointerGraphBuilder::FuncGraph,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::LLVMPointerGraphBuilder::FuncGraph>_>_>
  ::unordered_map((unordered_map<const_llvm::Function_*,_dg::pta::LLVMPointerGraphBuilder::FuncGraph,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::LLVMPointerGraphBuilder::FuncGraph>_>_>
                   *)0x150054);
  std::
  unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
  ::unordered_map((unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
                   *)0x150065);
  std::
  unordered_map<const_llvm::Function_*,_dg::pta::PointerSubgraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>_>
  ::unordered_map((unordered_map<const_llvm::Function_*,_dg::pta::PointerSubgraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>_>
                   *)0x150076);
  std::vector<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>::vector
            ((vector<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_> *)0x150087);
  std::vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>::vector
            ((vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_> *)0x150098);
  return;
}

Assistant:

LLVMPointerGraphBuilder(const llvm::Module *m,
                            const LLVMPointerAnalysisOptions &opts)
            : M(m), _options(opts), threads_(opts.threads) {}